

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-write-queue-order.c
# Opt level: O2

void connection_cb(uv_stream_t *server,int status)

{
  int iVar1;
  char *__format;
  char *pcVar2;
  char *pcVar3;
  uv_tcp_t *puVar4;
  undefined8 uVar5;
  int64_t eval_b;
  uv_buf_t buf;
  int64_t eval_b_4;
  
  if (server == (uv_stream_t *)&tcp_server) {
    server = (uv_stream_t *)(long)status;
    buf.base = (char *)server;
    if (server == (uv_stream_t *)0x0) {
      iVar1 = uv_tcp_init(tcp_server.loop,&tcp_peer);
      server = (uv_stream_t *)(long)iVar1;
      buf.base = (char *)server;
      if (server == (uv_stream_t *)0x0) {
        iVar1 = uv_accept(&tcp_server,&tcp_peer);
        server = (uv_stream_t *)(long)iVar1;
        buf.base = (char *)server;
        if (server == (uv_stream_t *)0x0) {
          iVar1 = uv_read_start(&tcp_peer,alloc_cb,read_cb);
          server = (uv_stream_t *)(long)iVar1;
          if (server == (uv_stream_t *)0x0) {
            buf.base = "hello\n";
            buf.len = 6;
            iVar1 = uv_write(&write_req,&tcp_peer,&buf,1,write_cb);
            server = (uv_stream_t *)(long)iVar1;
            if (server == (uv_stream_t *)0x0) {
              return;
            }
            pcVar2 = "r";
            uVar5 = 0x40;
          }
          else {
            pcVar2 = "r";
            uVar5 = 0x3a;
            buf.base = (char *)server;
          }
        }
        else {
          pcVar2 = "r";
          uVar5 = 0x37;
        }
      }
      else {
        pcVar2 = "r";
        uVar5 = 0x34;
      }
    }
    else {
      pcVar2 = "status";
      uVar5 = 0x31;
    }
    puVar4 = (uv_tcp_t *)0x0;
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
    pcVar3 = "0";
  }
  else {
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
    pcVar2 = "server";
    uVar5 = 0x30;
    puVar4 = &tcp_server;
    pcVar3 = "(uv_stream_t*)&tcp_server";
  }
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-write-to-half-open-connection.c"
          ,uVar5,pcVar2,"==",pcVar3,server,"==",puVar4);
  abort();
}

Assistant:

static void connection_cb(uv_stream_t* tcp, int status) {
  ASSERT_OK(status);

  ASSERT_OK(uv_tcp_init(tcp->loop, &incoming));
  ASSERT_OK(uv_accept(tcp, (uv_stream_t*) &incoming));

  ASSERT_OK(uv_timer_init(uv_default_loop(), &timer));
  ASSERT_OK(uv_timer_start(&timer, timer_cb, 1000, 0));

  connection_cb_called++;
}